

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O0

void __thiscall CLabelTable::DumpForCSpect(CLabelTable *this)

{
  short sVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  reference __k;
  mapped_type *pmVar6;
  SLabelTableEntry *pSVar7;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  byte *local_b0;
  char *strToUpper;
  char *localLabelStart;
  aint longAddress;
  short page;
  int labelType;
  mapped_type *symbol;
  key_type *name;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  order;
  int CSD_PAGE_MASK;
  int CSD_PAGE_SIZE;
  string local_38;
  FILE *local_18;
  FILE *file;
  CLabelTable *this_local;
  
  file = (FILE *)this;
  local_18 = (FILE *)SJ_fopen((path *)Options::CSpectMapFName_abi_cxx11_,"w");
  if (local_18 == (FILE *)0x0) {
    std::filesystem::__cxx11::path::string(&local_38,(path *)Options::CSpectMapFName_abi_cxx11_);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    Error("opening file for write",pcVar5,FATAL);
    std::__cxx11::string::~string((string *)&local_38);
  }
  iVar2 = Options::CSpectMapPageSize;
  order.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = Options::CSpectMapPageSize - 1;
  getDumpOrder((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1,&this->symbols);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1);
  name = (key_type *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&name);
    if (!bVar3) {
      fclose(local_18);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1);
      return;
    }
    __k = __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end1);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry>_>_>
             ::at(&this->symbols,__k);
    if (pmVar6->page != -1) {
      if ((pmVar6->traits & 0x10) == 0) {
        if ((pmVar6->traits & 8) == 0) {
          if ((pmVar6->traits & 4) == 0) {
            if ((pmVar6->traits & 2) == 0) {
              local_d8 = 0;
              if (0x7eff < pmVar6->page) {
                local_d8 = 3;
              }
            }
            else {
              local_d8 = 2;
            }
            local_d4 = local_d8;
          }
          else {
            local_d4 = 1;
          }
          local_d0 = local_d4;
        }
        else {
          local_d0 = 4;
        }
        local_cc = local_d0;
      }
      else {
        local_cc = 0;
      }
      if (local_cc == 0) {
        sVar1 = pmVar6->page;
      }
      else {
        sVar1 = 0;
      }
      fprintf(local_18,"%08X %08X %02X ",(ulong)(pmVar6->value & 0xffff),
              (ulong)((order.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ & pmVar6->value) +
                     sVar1 * iVar2),(ulong)local_cc);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      strcpy(temp,pcVar5);
      strToUpper = strrchr(temp,0x2e);
      while (temp < strToUpper) {
        *strToUpper = '\0';
        pSVar7 = Find(this,temp,true);
        if (pSVar7 != (SLabelTableEntry *)0x0) {
          *strToUpper = '@';
          break;
        }
        *strToUpper = '.';
        do {
          strToUpper = strToUpper + -1;
          bVar3 = false;
          if (temp < strToUpper) {
            bVar3 = *strToUpper != '.';
          }
        } while (bVar3);
      }
      local_b0 = (byte *)temp;
      while( true ) {
        iVar4 = toupper((uint)*local_b0);
        *local_b0 = (byte)iVar4;
        if ((byte)iVar4 == 0) break;
        local_b0 = local_b0 + 1;
      }
      fprintf(local_18,"%s\n",temp);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void CLabelTable::DumpForCSpect() {
	FILE* file;
	if (!FOPEN_ISOK(file, Options::CSpectMapFName, "w")) {
		Error("opening file for write", Options::CSpectMapFName.string().c_str(), FATAL);
	}
	const int CSD_PAGE_SIZE = Options::CSpectMapPageSize;
	const int CSD_PAGE_MASK = CSD_PAGE_SIZE - 1;
	const auto order = getDumpOrder(symbols);
	for (const symbol_map_t::key_type& name: order) {
		const symbol_map_t::mapped_type& symbol = symbols.at(name);
		if (LABEL_PAGE_UNDEFINED == symbol.page) continue;
		const int labelType =
			(symbol.traits&LABEL_IS_STRUCT_E) ? 0 :
			(symbol.traits&LABEL_IS_STRUCT_D) ? 4 :
			(symbol.traits&LABEL_IS_EQU) ? 1 :
			(symbol.traits&LABEL_IS_DEFL) ? 2 :
			(LABEL_PAGE_ROM <= symbol.page) ? 3 : 0;
		const short page = labelType ? 0 : symbol.page;
			// TODO:
			// page == -1 will put regular EQU like "BLUE" out of reach for disassembly window
			// (otherwise BLUE becomes label for address $C001 with default mapping)
			// BUT then it would be nice to provide real page data for equ which have them explicit
			// BUT I can't distinguish explicit/implicit page number, as there's heuristic to use current mapping
			// instead of using the LABEL_PAGE_OUT_OF_BOUNDS page number...
			// TODO: figure out when/why the implicit page number heuristic happenned and if you can detect
			// only explicit page numbers used in EQU, and export only those

		const aint longAddress = (CSD_PAGE_MASK & symbol.value) + page * CSD_PAGE_SIZE;
		fprintf(file, "%08X %08X %02X ", 0xFFFF & symbol.value, longAddress, labelType);
		// convert primary+local label to be "@" delimited (not "." delimited)
		STRCPY(temp, LINEMAX, name.c_str());
		// look for "primary" label (where the local label starts)
		char* localLabelStart = strrchr(temp, '.');
		while (temp < localLabelStart) {	// the dot must be at least second character
			*localLabelStart = 0;			// terminate the possible "primary" part
			if (Find(temp, true)) {
				*localLabelStart = '@';
				break;
			}
			*localLabelStart = '.';			// "primary" label didn't work, restore dot
			do {
				--localLabelStart;			// and look for next dot
			} while (temp < localLabelStart && '.' != *localLabelStart);
		}
		// convert whole label to upper-case, as CSpect search is malfunctioning otherwise.
		char* strToUpper = temp;
		while ((*strToUpper = (char) toupper((byte)*strToUpper))) { ++strToUpper; }
		fprintf(file, "%s\n", temp);
	}
	fclose(file);
}